

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
delta_complex_t::delta_complex_t(delta_complex_t *this,vector<int,_std::allocator<int>_> *vertices)

{
  pointer piVar1;
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> *this_00;
  vector<clique_t,_std::allocator<clique_t>_> *this_01;
  ulong _vertex;
  delta_complex_cell_t dStack_118;
  
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_dimension(this);
  for (_vertex = 0;
      piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      _vertex < (ulong)((long)(vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      _vertex = _vertex + 1) {
    this_00 = (this->cells).
              super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    delta_complex_cell_t::delta_complex_cell_t(&dStack_118,_vertex,(float)piVar1[_vertex]);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
    emplace_back<delta_complex_cell_t>(this_00,&dStack_118);
    delta_complex_cell_t::~delta_complex_cell_t(&dStack_118);
    this_01 = (this->cliques).
              super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    clique_t::clique_t((clique_t *)&dStack_118,_vertex);
    std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
              (this_01,(clique_t *)&dStack_118);
    clique_t::~clique_t((clique_t *)&dStack_118);
  }
  return;
}

Assistant:

delta_complex_t(std::vector<int> vertices){
		add_dimension();
		for( int i = 0; i < vertices.size(); i++ ){
            cells[0].push_back(delta_complex_cell_t(i,vertices[i]));
			cliques[0].push_back(clique_t(i));
        }
	}